

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaiser_window.cc
# Opt level: O3

void __thiscall
sptk::KaiserWindow::KaiserWindow(KaiserWindow *this,int window_length,double beta,bool periodic)

{
  vector<double,_std::allocator<double>_> *this_00;
  double dVar1;
  pointer pdVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  (this->super_WindowInterface)._vptr_WindowInterface = (_func_int **)&PTR__KaiserWindow_0011fc40;
  this->window_length_ = window_length;
  this->beta_ = beta;
  this->periodic_ = periodic;
  this->is_valid_ = true;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((window_length < 1) || (beta < 0.0)) {
    this->is_valid_ = false;
  }
  else {
    this_00 = &this->window_;
    std::vector<double,_std::allocator<double>_>::resize(this_00,(ulong)(uint)window_length);
    iVar5 = this->window_length_;
    if (iVar5 == 1) {
      *(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start = 1.0;
    }
    else {
      dVar12 = 1.0;
      iVar6 = 1;
      dVar1 = 1.0;
      do {
        dVar12 = ((this->beta_ * 0.5) / (double)iVar6) * dVar12;
        dVar3 = dVar12 * dVar12 + dVar1;
        if (dVar3 - dVar1 < 1e-06) break;
        bVar8 = iVar6 != 499;
        iVar6 = iVar6 + 1;
        dVar1 = dVar3;
      } while (bVar8);
      if (0 < iVar5) {
        dVar12 = (double)(int)(iVar5 - (this->periodic_ ^ 1)) * 0.5;
        pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar7 = 0;
        do {
          dVar9 = ((double)(int)lVar7 - dVar12) / dVar12;
          dVar1 = this->beta_;
          dVar9 = 1.0 - dVar9 * dVar9;
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          dVar4 = 1.0;
          dVar10 = 1.0;
          iVar5 = 1;
          do {
            dVar4 = ((dVar1 * dVar9 * 0.5) / (double)iVar5) * dVar4;
            dVar11 = dVar4 * dVar4 + dVar10;
            if (dVar11 - dVar10 < 1e-06) break;
            bVar8 = iVar5 != 499;
            dVar10 = dVar11;
            iVar5 = iVar5 + 1;
          } while (bVar8);
          pdVar2[lVar7] = dVar11 * (1.0 / dVar3);
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->window_length_);
      }
    }
  }
  return;
}

Assistant:

KaiserWindow::KaiserWindow(int window_length, double beta, bool periodic)
    : window_length_(window_length),
      beta_(beta),
      periodic_(periodic),
      is_valid_(true) {
  if (window_length_ <= 0 || beta_ < 0.0) {
    is_valid_ = false;
    return;
  }

  window_.resize(window_length);
  if (1 == window_length_) {
    window_[0] = 1.0;
    return;
  }

  const double a(0.5 * (periodic_ ? window_length_ : window_length_ - 1));
  const double z(1.0 / I0(beta_));
  double* window(&(window_[0]));
  for (int i(0); i < window_length_; ++i) {
    const double x((i - a) / a);
    window[i] = z * I0(beta_ * std::sqrt(1.0 - x * x));
  }
}